

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmyblas2.c
# Opt level: O2

void zmatvec(int ldm,int nrow,int ncol,doublecomplex *M,doublecomplex *vec,doublecomplex *Mxvec)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  double dVar17;
  double dVar18;
  
  lVar13 = (long)ldm;
  uVar15 = 0;
  uVar14 = (ulong)(uint)nrow;
  if (nrow < 1) {
    uVar14 = uVar15;
  }
  for (; (long)uVar15 < (long)(ncol + -3); uVar15 = uVar15 + 4) {
    dVar7 = vec[uVar15].r;
    dVar8 = vec[uVar15].i;
    dVar5 = vec[uVar15 + 1].r;
    dVar6 = vec[uVar15 + 1].i;
    dVar9 = vec[uVar15 + 2].r;
    dVar10 = vec[uVar15 + 2].i;
    dVar11 = vec[uVar15 + 3].r;
    dVar12 = vec[uVar15 + 3].i;
    for (lVar16 = 0; uVar14 << 4 != lVar16; lVar16 = lVar16 + 0x10) {
      pdVar1 = (double *)((long)&M->r + lVar16);
      pdVar2 = (double *)((long)&Mxvec->r + lVar16);
      dVar17 = *pdVar2 + *pdVar1 * dVar7 + pdVar1[1] * -dVar8;
      dVar18 = pdVar2[1] + *pdVar1 * dVar8 + pdVar1[1] * dVar7;
      pdVar2 = (double *)((long)&Mxvec->r + lVar16);
      *pdVar2 = dVar17;
      pdVar2[1] = dVar18;
      dVar17 = pdVar1[lVar13 * 2] * dVar5 + pdVar1[lVar13 * 2 + 1] * -dVar6 + dVar17;
      dVar18 = pdVar1[lVar13 * 2] * dVar6 + pdVar1[lVar13 * 2 + 1] * dVar5 + dVar18;
      pdVar2 = (double *)((long)&Mxvec->r + lVar16);
      *pdVar2 = dVar17;
      pdVar2[1] = dVar18;
      dVar17 = pdVar1[lVar13 * 4] * dVar9 + pdVar1[lVar13 * 4 + 1] * -dVar10 + dVar17;
      dVar18 = pdVar1[lVar13 * 4] * dVar10 + pdVar1[lVar13 * 4 + 1] * dVar9 + dVar18;
      pdVar2 = (double *)((long)&Mxvec->r + lVar16);
      *pdVar2 = dVar17;
      pdVar2[1] = dVar18;
      dVar3 = pdVar1[lVar13 * 6];
      dVar4 = pdVar1[lVar13 * 6 + 1];
      pdVar1 = (double *)((long)&Mxvec->r + lVar16);
      *pdVar1 = dVar3 * dVar11 + dVar4 * -dVar12 + dVar17;
      pdVar1[1] = dVar3 * dVar12 + dVar4 * dVar11 + dVar18;
    }
    M = M + ldm * 4;
  }
  for (; (long)uVar15 < (long)ncol; uVar15 = uVar15 + 1) {
    dVar7 = vec[uVar15].r;
    dVar8 = vec[uVar15].i;
    for (lVar16 = 0; uVar14 << 4 != lVar16; lVar16 = lVar16 + 0x10) {
      dVar5 = *(double *)((long)&M->r + lVar16);
      dVar6 = *(double *)((long)&M->i + lVar16);
      pdVar1 = (double *)((long)&Mxvec->r + lVar16);
      dVar9 = pdVar1[1];
      pdVar2 = (double *)((long)&Mxvec->r + lVar16);
      *pdVar2 = *pdVar1 + dVar5 * dVar7 + dVar6 * -dVar8;
      pdVar2[1] = dVar9 + dVar5 * dVar8 + dVar6 * dVar7;
    }
    M = M + lVar13;
  }
  return;
}

Assistant:

void zmatvec (int ldm, int nrow, int ncol, doublecomplex *M, doublecomplex *vec, doublecomplex *Mxvec)
{
    doublecomplex vi0, vi1, vi2, vi3;
    doublecomplex *M0, temp;
    doublecomplex *Mki0, *Mki1, *Mki2, *Mki3;
    register int firstcol = 0;
    int k;

    M0 = &M[0];

    while ( firstcol < ncol - 3 ) {	/* Do 4 columns */
	Mki0 = M0;
	Mki1 = Mki0 + ldm;
	Mki2 = Mki1 + ldm;
	Mki3 = Mki2 + ldm;

	vi0 = vec[firstcol++];
	vi1 = vec[firstcol++];
	vi2 = vec[firstcol++];
	vi3 = vec[firstcol++];	
	for (k = 0; k < nrow; k++) {
	    zz_mult(&temp, &vi0, Mki0); Mki0++;
	    z_add(&Mxvec[k], &Mxvec[k], &temp);
	    zz_mult(&temp, &vi1, Mki1); Mki1++;
	    z_add(&Mxvec[k], &Mxvec[k], &temp);
	    zz_mult(&temp, &vi2, Mki2); Mki2++;
	    z_add(&Mxvec[k], &Mxvec[k], &temp);
	    zz_mult(&temp, &vi3, Mki3); Mki3++;
	    z_add(&Mxvec[k], &Mxvec[k], &temp);
	}

	M0 += 4 * ldm;
    }

    while ( firstcol < ncol ) {		/* Do 1 column */
 	Mki0 = M0;
	vi0 = vec[firstcol++];
	for (k = 0; k < nrow; k++) {
	    zz_mult(&temp, &vi0, Mki0); Mki0++;
	    z_add(&Mxvec[k], &Mxvec[k], &temp);
	}
	M0 += ldm;
    }
	
}